

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw.c
# Opt level: O1

char * raw_init(BackendVtable *vt,Seat *seat,Backend **backend_handle,LogContext *logctx,Conf *conf,
               char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  int iVar1;
  undefined8 *puVar2;
  Conf *pCVar3;
  char *pcVar4;
  SockAddr *addr;
  Socket *pSVar5;
  
  puVar2 = (undefined8 *)safemalloc(1,0x78,0);
  puVar2[8] = 0;
  puVar2[9] = 0;
  puVar2[10] = 0;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  puVar2[0xd] = 0;
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[0xe] = 0;
  puVar2[9] = &Raw_plugvt;
  puVar2[10] = vt;
  puVar2[0xc] = &Raw_interactorvt;
  puVar2[0xb] = (Interactor *)(puVar2 + 0xc);
  *puVar2 = 0;
  *(undefined1 *)(puVar2 + 1) = 0;
  *backend_handle = (Backend *)(puVar2 + 10);
  *(undefined2 *)((long)puVar2 + 0x31) = 0;
  *(undefined1 *)(puVar2 + 6) = 0;
  puVar2[2] = 0;
  pCVar3 = conf_copy(conf);
  puVar2[8] = pCVar3;
  pcVar4 = default_description(vt,host,port);
  puVar2[7] = pcVar4;
  puVar2[3] = seat;
  puVar2[4] = logctx;
  iVar1 = conf_get_int(conf,3);
  addr = name_lookup(host,port,realhost,conf,iVar1,(LogContext *)puVar2[4],"main connection");
  pcVar4 = sk_addr_error(addr);
  if (pcVar4 == (char *)0x0) {
    iVar1 = 0x17;
    if (-1 < port) {
      iVar1 = port;
    }
    pSVar5 = new_connection(addr,*realhost,iVar1,false,true,nodelay,keepalive,(Plug *)(puVar2 + 9),
                            conf,(Interactor *)(puVar2 + 0xc));
    *puVar2 = pSVar5;
    pcVar4 = (*pSVar5->vt->socket_error)(pSVar5);
    if (pcVar4 == (char *)0x0) {
      (**(code **)(*(long *)puVar2[3] + 0xb0))((long *)puVar2[3],0);
      pcVar4 = conf_get_str(conf,9);
      if (*pcVar4 != '\0') {
        safefree(*realhost);
        pcVar4 = dupstr(pcVar4);
        *realhost = pcVar4;
        pcVar4 = host_strrchr(pcVar4,0x3a);
        if (pcVar4 != (char *)0x0) {
          *pcVar4 = '\0';
        }
      }
      return (char *)0x0;
    }
  }
  else {
    sk_addr_free(addr);
  }
  pcVar4 = dupstr(pcVar4);
  return pcVar4;
}

Assistant:

static char *raw_init(const BackendVtable *vt, Seat *seat,
                      Backend **backend_handle, LogContext *logctx,
                      Conf *conf, const char *host, int port,
                      char **realhost, bool nodelay, bool keepalive)
{
    SockAddr *addr;
    const char *err;
    Raw *raw;
    int addressfamily;
    char *loghost;

    raw = snew(Raw);
    memset(raw, 0, sizeof(Raw));
    raw->plug.vt = &Raw_plugvt;
    raw->backend.vt = vt;
    raw->interactor.vt = &Raw_interactorvt;
    raw->backend.interactor = &raw->interactor;
    raw->s = NULL;
    raw->closed_on_socket_error = false;
    *backend_handle = &raw->backend;
    raw->sent_console_eof = raw->sent_socket_eof = false;
    raw->bufsize = 0;
    raw->socket_connected = false;
    raw->conf = conf_copy(conf);
    raw->description = default_description(vt, host, port);

    raw->seat = seat;
    raw->logctx = logctx;

    addressfamily = conf_get_int(conf, CONF_addressfamily);
    /*
     * Try to find host.
     */
    addr = name_lookup(host, port, realhost, conf, addressfamily,
                       raw->logctx, "main connection");
    if ((err = sk_addr_error(addr)) != NULL) {
        sk_addr_free(addr);
        return dupstr(err);
    }

    if (port < 0)
        port = 23;                     /* default telnet port */

    /*
     * Open socket.
     */
    raw->s = new_connection(addr, *realhost, port, false, true, nodelay,
                            keepalive, &raw->plug, conf, &raw->interactor);
    if ((err = sk_socket_error(raw->s)) != NULL)
        return dupstr(err);

    /* No local authentication phase in this protocol */
    seat_set_trust_status(raw->seat, false);

    loghost = conf_get_str(conf, CONF_loghost);
    if (*loghost) {
        char *colon;

        sfree(*realhost);
        *realhost = dupstr(loghost);

        colon = host_strrchr(*realhost, ':');
        if (colon)
            *colon++ = '\0';
    }

    return NULL;
}